

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

int strbin(char *str)

{
  char cVar1;
  char *pcVar2;
  int local_28;
  char local_21;
  int i;
  char c;
  char *p;
  char *start;
  char *str_local;
  
  _i = str;
  start = str;
  do {
    while( true ) {
      pcVar2 = _i + 1;
      cVar1 = *_i;
      if (cVar1 == '\0') {
        *start = '\0';
        return (int)start - (int)str;
      }
      _i = pcVar2;
      if (cVar1 == '\\') break;
      *start = cVar1;
      start = start + 1;
    }
    switch(*pcVar2) {
    case '\n':
      break;
    default:
      *start = *pcVar2;
      start = start + 1;
      break;
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
      local_21 = '\0';
      local_28 = 0;
      for (; ((local_28 < 3 && (local_21 = local_21 * '\b', '/' < *_i)) && (*_i < '8')); _i = _i + 1
          ) {
        local_21 = local_21 + *_i + -0x30;
        local_28 = local_28 + 1;
      }
      *start = local_21;
      start = start + 1;
      break;
    case '?':
      *start = '?';
      start = start + 1;
      break;
    case 'X':
    case 'x':
      local_21 = '\0';
      for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
        pcVar2 = _i + 1;
        if ((*pcVar2 < '0') || ('9' < *pcVar2)) {
          if ((*pcVar2 < 'a') || ('f' < *pcVar2)) {
            if ((*pcVar2 < 'A') || ('F' < *pcVar2)) break;
            local_21 = local_21 * '\x10' + *pcVar2 + -0x37;
          }
          else {
            local_21 = local_21 * '\x10' + *pcVar2 + -0x57;
          }
        }
        else {
          local_21 = local_21 * '\x10' + *pcVar2 + -0x30;
        }
        _i = pcVar2;
      }
      *start = local_21;
      start = start + 1;
      break;
    case 'a':
      *start = '\a';
      start = start + 1;
      break;
    case 'b':
      *start = '\b';
      start = start + 1;
      break;
    case 'c':
      *start = '\x1c';
      start = start + 1;
      break;
    case 'f':
      *start = '\f';
      start = start + 1;
      break;
    case 'n':
      *start = '\n';
      start = start + 1;
      break;
    case 'r':
      *start = '\r';
      start = start + 1;
      break;
    case 't':
      *start = '\t';
      start = start + 1;
      break;
    case 'v':
      *start = '\v';
      start = start + 1;
    }
    _i = _i + 1;
  } while( true );
}

Assistant:

int strbin (char *str)
{
	char *start = str;
	char *p = str, c;
	int i;

	while ( (c = *p++) ) {
		if (c != '\\') {
			*str++ = c;
		} else {
			switch (*p) {
				case 'a':
					*str++ = '\a';
					break;
				case 'b':
					*str++ = '\b';
					break;
				case 'c':
					*str++ = '\034';	// TEXTCOLOR_ESCAPE
					break;
				case 'f':
					*str++ = '\f';
					break;
				case 'n':
					*str++ = '\n';
					break;
				case 't':
					*str++ = '\t';
					break;
				case 'r':
					*str++ = '\r';
					break;
				case 'v':
					*str++ = '\v';
					break;
				case '?':
					*str++ = '\?';
					break;
				case '\n':
					break;
				case 'x':
				case 'X':
					c = 0;
					for (i = 0; i < 2; i++)
					{
						p++;
						if (*p >= '0' && *p <= '9')
							c = (c << 4) + *p-'0';
						else if (*p >= 'a' && *p <= 'f')
							c = (c << 4) + 10 + *p-'a';
						else if (*p >= 'A' && *p <= 'F')
							c = (c << 4) + 10 + *p-'A';
						else
						{
							p--;
							break;
						}
					}
					*str++ = c;
					break;
				case '0':
				case '1':
				case '2':
				case '3':
				case '4':
				case '5':
				case '6':
				case '7':
					c = 0;
					for (i = 0; i < 3; i++) {
						c <<= 3;
						if (*p >= '0' && *p <= '7')
							c += *p-'0';
						else
							break;
						p++;
					}
					*str++ = c;
					break;
				default:
					*str++ = *p;
					break;
			}
			p++;
		}
	}
	*str = 0;
	return int(str - start);
}